

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.cc
# Opt level: O1

bool SumFile(string *out_hex,EVP_MD *md,Source *source)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  void *__s;
  ulong uVar5;
  ScopedFD fd;
  byte *md_00;
  ScopedFD scoped_fd;
  uint digest_len;
  ScopedEVP_MD_CTX ctx;
  char hex_digest [128];
  uint8_t digest [64];
  ScopedFD local_148;
  uint local_144;
  string *local_140;
  undefined1 local_138 [32];
  EVP_PKEY_CTX *local_118;
  long local_108 [2];
  string local_f8 [4];
  byte local_78 [72];
  
  local_148.fd_ = -1;
  fd.fd_ = 0;
  if (source->is_stdin_ == false) {
    OpenFile(local_f8);
    if (-1 < local_148.fd_) {
      CloseFD(local_148.fd_);
    }
    local_148.fd_ = (int)local_f8[0]._M_dataplus._M_p;
    local_f8[0]._M_dataplus._M_p._0_4_ = -1;
    ScopedFD::~ScopedFD((ScopedFD *)local_f8);
    fd.fd_ = local_148.fd_;
    if (local_148.fd_ < 0) {
      bVar2 = false;
      goto LAB_001252e3;
    }
  }
  __s = operator_new__(0x2000);
  memset(__s,0,0x2000);
  EVP_MD_CTX_init((EVP_MD_CTX *)local_138);
  iVar3 = EVP_DigestInit_ex((EVP_MD_CTX *)local_138,(EVP_MD *)md,(ENGINE *)0x0);
  if (iVar3 == 0) {
    SumFile();
LAB_001252cf:
    bVar2 = false;
  }
  else {
    local_140 = out_hex;
    do {
      bVar2 = ReadFromFD(fd.fd_,(size_t *)local_f8,__s,0x2000);
      if (bVar2) {
        if (CONCAT44(local_f8[0]._M_dataplus._M_p._4_4_,(int)local_f8[0]._M_dataplus._M_p) == 0) {
          iVar3 = 2;
        }
        else {
          iVar4 = EVP_DigestUpdate((EVP_MD_CTX *)local_138,__s,
                                   CONCAT44(local_f8[0]._M_dataplus._M_p._4_4_,
                                            (int)local_f8[0]._M_dataplus._M_p));
          iVar3 = 0;
          if (iVar4 == 0) {
            SumFile();
            goto LAB_001251fa;
          }
        }
      }
      else {
        SumFile();
LAB_001251fa:
        iVar3 = 1;
      }
    } while (iVar3 == 0);
    if (iVar3 != 2) goto LAB_001252cf;
    md_00 = local_78;
    iVar3 = EVP_DigestFinal_ex((EVP_MD_CTX *)local_138,md_00,&local_144);
    bVar2 = iVar3 != 0;
    if (iVar3 == 0) {
      SumFile();
    }
    else {
      if ((ulong)local_144 != 0) {
        uVar5 = 0;
        do {
          bVar1 = *md_00;
          *(char *)((long)&local_f8[0]._M_dataplus._M_p + (uVar5 & 0xffffffff)) =
               "0123456789abcdef"[bVar1 >> 4];
          *(char *)((long)&local_f8[0]._M_dataplus._M_p + (ulong)((int)uVar5 + 1)) =
               "0123456789abcdef"[bVar1 & 0xf];
          md_00 = md_00 + 1;
          uVar5 = uVar5 + 2;
        } while ((ulong)local_144 * 2 != uVar5);
      }
      local_118 = (EVP_PKEY_CTX *)local_108;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,local_f8,
                 (long)&local_f8[0]._M_dataplus._M_p + (ulong)(local_144 * 2));
      std::__cxx11::string::operator=((string *)local_140,(string *)&local_118);
      if (local_118 != (EVP_PKEY_CTX *)local_108) {
        operator_delete(local_118,local_108[0] + 1);
      }
    }
  }
  EVP_MD_CTX_cleanup((EVP_MD_CTX *)local_138);
  operator_delete__(__s);
LAB_001252e3:
  ScopedFD::~ScopedFD(&local_148);
  return bVar2;
}

Assistant:

static bool SumFile(std::string *out_hex, const EVP_MD *md,
                    const Source &source) {
  ScopedFD scoped_fd;
  int fd;

  if (source.is_stdin()) {
    fd = 0;
  } else {
    scoped_fd = OpenFile(source.filename());
    if (!scoped_fd) {
      return false;
    }
    fd = scoped_fd.get();
  }

  static const size_t kBufSize = 8192;
  auto buf = std::make_unique<uint8_t[]>(kBufSize);

  bssl::ScopedEVP_MD_CTX ctx;
  if (!EVP_DigestInit_ex(ctx.get(), md, NULL)) {
    fprintf(stderr, "Failed to initialize EVP_MD_CTX.\n");
    return false;
  }

  for (;;) {
    size_t n;
    if (!ReadFromFD(fd, &n, buf.get(), kBufSize)) {
      fprintf(stderr, "Failed to read from %s: %s\n",
              source.is_stdin() ? kStdinName : source.filename().c_str(),
              strerror(errno));
      return false;
    }

    if (n == 0) {
      break;
    }

    if (!EVP_DigestUpdate(ctx.get(), buf.get(), n)) {
      fprintf(stderr, "Failed to update hash.\n");
      return false;
    }
  }

  uint8_t digest[EVP_MAX_MD_SIZE];
  unsigned digest_len;
  if (!EVP_DigestFinal_ex(ctx.get(), digest, &digest_len)) {
    fprintf(stderr, "Failed to finish hash.\n");
    return false;
  }

  char hex_digest[EVP_MAX_MD_SIZE * 2];
  static const char kHextable[] = "0123456789abcdef";
  for (unsigned i = 0; i < digest_len; i++) {
    const uint8_t b = digest[i];
    hex_digest[i * 2] = kHextable[b >> 4];
    hex_digest[i * 2 + 1] = kHextable[b & 0xf];
  }
  *out_hex = std::string(hex_digest, digest_len * 2);

  return true;
}